

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::compareEqual<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::Matrix<double,_1,1,0,_1,1>>
               (Matrix<double,__1,_1,_0,__1,_1> *lhs,Matrix<double,__1,_1,_0,__1,_1> *rhs)

{
  bool bVar1;
  Matrix<double,__1,_1,_0,__1,_1> *rhs_local;
  Matrix<double,__1,_1,_0,__1,_1> *lhs_local;
  
  bVar1 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator==
                    ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)lhs,
                     (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)rhs);
  return bVar1;
}

Assistant:

auto compareEqual( LhsT const& lhs, RhsT const& rhs ) -> bool { return static_cast<bool>(lhs == rhs); }